

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O3

void __thiscall SuiteDataDictionaryTests::TestaddGroup::~TestaddGroup(TestaddGroup *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(addGroup)
{
  DataDictionary object;
  object.setVersion( "FIX.4.2" );

  DataDictionary group1;
  group1.addMsgType( "1" );
  DataDictionary group2;
  group2.addMsgType( "2" );
  DataDictionary group3;
  group3.addMsgType( "3" );

  object.addGroup( "A", 100, 101, group1 );
  object.addGroup( "A", 200, 201, group2 );
  object.addGroup( "A", 300, 301, group3 );

  int delim;
  const DataDictionary* pDD = 0;

  CHECK( object.getGroup( "A", 100, delim, pDD ) );
  CHECK_EQUAL( 101, delim );
  CHECK( pDD->isMsgType( "1" ) );

  CHECK( object.getGroup( "A", 200, delim, pDD ) );
  CHECK_EQUAL( 201, delim );
  CHECK( pDD->isMsgType( "2" ) );

  CHECK( object.getGroup( "A", 300, delim, pDD ) );
  CHECK_EQUAL( 301, delim );
  CHECK( pDD->isMsgType( "3" ) );
}